

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

void * myMallocFunc(size_t size)

{
  int iVar1;
  void *ret;
  size_t size_local;
  
  iVar1 = xmlMemUsed();
  if ((ulong)(long)xmllintMaxmem < (long)iVar1 + size) {
    xmllintMaxmemReached = 1;
    xmllintOom = 1;
    size_local = 0;
  }
  else {
    size_local = xmlMemMalloc(size);
    if (size_local == 0) {
      xmllintOom = 1;
    }
  }
  return (void *)size_local;
}

Assistant:

static void *
myMallocFunc(size_t size) {
    void *ret;

    if (xmlMemUsed() + size > (size_t) xmllintMaxmem) {
#if XMLLINT_ABORT_ON_FAILURE
        abort();
#endif
        xmllintMaxmemReached = 1;
        xmllintOom = 1;
        return(NULL);
    }

    ret = xmlMemMalloc(size);
    if (ret == NULL)
        xmllintOom = 1;

    return(ret);
}